

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::util_ParseMoney::test_method(util_ParseMoney *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  optional<long> oVar4;
  check_type cVar5;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  ulong local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  assertion_result local_120;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 local_e0 [8];
  assertion_result local_d8;
  string *local_c0;
  assertion_result local_b8;
  assertion_result local_a0;
  _Storage<long,_true> local_88;
  undefined1 local_80;
  string local_78;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17b;
  file.m_begin = (iterator)&local_f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg);
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_01388f08;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"0.0","");
  oVar4 = ParseMoney(&local_78);
  local_88._M_value =
       oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
  if (((undefined1  [16])
       oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    local_e0 = (undefined1  [8])&local_1c8;
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_88._M_value == 0);
    local_1c8 = local_1c8 & 0xffffffff00000000;
    local_a0.m_message.px = (element_type *)0x0;
    local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_b8.m_message.px = (element_type *)0xf4a348;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
    local_b8._0_8_ = &local_88;
    local_48._8_8_ = &local_b8;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013892a8;
    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_c0 = (string *)local_e0;
    local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
    local_d8._0_8_ = &PTR__lazy_ostream_013890c8;
    local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar2 = (iterator)0x1;
    pvVar3 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b692,(size_t)&local_b8.m_message
               ,0x17b,local_58,"0",local_e0 + 8);
    boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_130 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_128 = "";
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x17c;
    file_00.m_begin = (iterator)&local_130;
    msg_00.m_end = pvVar3;
    msg_00.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
               msg_00);
    local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
    local_120._0_8_ = &PTR__lazy_ostream_01388f08;
    local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_108 = "";
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".","");
    oVar4 = ParseMoney(&local_78);
    local_88._M_value =
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
    if (((undefined1  [16])
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_1c8 = local_1c8 & 0xffffffff00000000;
      local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_88._M_value == 0);
      local_a0.m_message.px = (element_type *)0x0;
      local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b8.m_message.px = (element_type *)0xf4a348;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
      local_b8._0_8_ = &local_88;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013892a8;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_48._8_8_ = &local_b8;
      local_e0 = (undefined1  [8])&local_1c8;
      local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
      local_d8._0_8_ = &PTR__lazy_ostream_013890c8;
      local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_c0 = (string *)local_e0;
      pvVar2 = (iterator)0x1;
      pvVar3 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b6ac,
                 (size_t)&local_b8.m_message,0x17c,local_58,"0",local_e0 + 8);
      boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      local_150 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_148 = "";
      local_160 = &boost::unit_test::basic_cstring<char_const>::null;
      local_158 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x17d;
      file_01.m_begin = (iterator)&local_150;
      msg_01.m_end = pvVar3;
      msg_01.m_begin = pvVar2;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_160,
                 msg_01);
      local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
      local_120._0_8_ = &PTR__lazy_ostream_01388f08;
      local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_108 = "";
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"0.","");
      oVar4 = ParseMoney(&local_78);
      local_88._M_value =
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_engaged;
      if (((undefined1  [16])
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        local_1c8 = local_1c8 & 0xffffffff00000000;
        local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(local_88._M_value == 0);
        local_a0.m_message.px = (element_type *)0x0;
        local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_b8.m_message.px = (element_type *)0xf4a348;
        local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
        local_b8._0_8_ = &local_88;
        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
        local_58._0_8_ = &PTR__lazy_ostream_013892a8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = &local_b8;
        local_e0 = (undefined1  [8])&local_1c8;
        local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
        local_d8._0_8_ = &PTR__lazy_ostream_013890c8;
        local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_c0 = (string *)local_e0;
        pvVar2 = (iterator)0x1;
        pvVar3 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b6c4,
                   (size_t)&local_b8.m_message,0x17d,local_58,"0",local_e0 + 8);
        boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        local_170 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_168 = "";
        local_180 = &boost::unit_test::basic_cstring<char_const>::null;
        local_178 = &boost::unit_test::basic_cstring<char_const>::null;
        file_02.m_end = (iterator)0x17e;
        file_02.m_begin = (iterator)&local_170;
        msg_02.m_end = pvVar3;
        msg_02.m_begin = pvVar2;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180
                   ,msg_02);
        local_120.m_message.px =
             (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
        local_120._0_8_ = &PTR__lazy_ostream_01388f08;
        local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_108 = "";
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".0","");
        oVar4 = ParseMoney(&local_78);
        local_88._M_value =
             oVar4.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_engaged;
        if (((undefined1  [16])
             oVar4.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          local_1c8 = local_1c8 & 0xffffffff00000000;
          local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(local_88._M_value == 0);
          local_a0.m_message.px = (element_type *)0x0;
          local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b8.m_message.px = (element_type *)0xf4a348;
          local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
          local_b8._0_8_ = &local_88;
          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
          local_58._0_8_ = &PTR__lazy_ostream_013892a8;
          local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          local_48._8_8_ = &local_b8;
          local_e0 = (undefined1  [8])&local_1c8;
          local_d8.m_message.px =
               (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
          local_d8._0_8_ = &PTR__lazy_ostream_013890c8;
          local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_c0 = (string *)local_e0;
          pvVar2 = (iterator)0x1;
          pvVar3 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b6dd,
                     (size_t)&local_b8.m_message,0x17e,local_58,"0",local_e0 + 8);
          boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          local_190 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_188 = "";
          local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_198 = &boost::unit_test::basic_cstring<char_const>::null;
          file_03.m_end = (iterator)0x17f;
          file_03.m_begin = (iterator)&local_190;
          msg_03.m_end = pvVar3;
          msg_03.m_begin = pvVar2;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_1a0,msg_03);
          local_120.m_message.px =
               (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
          local_120._0_8_ = &PTR__lazy_ostream_01388f08;
          local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_108 = "";
          local_78._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".6789","");
          oVar4 = ParseMoney(&local_78);
          local_88._M_value =
               oVar4.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
          local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_engaged;
          if (((undefined1  [16])
               oVar4.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            local_1c8 = CONCAT44(local_1c8._4_4_,0x40beb50);
            local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(local_88._M_value == 0x40beb50);
            local_a0.m_message.px = (element_type *)0x0;
            local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_b8.m_message.px = (element_type *)0xf4a348;
            local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
            local_b8._0_8_ = &local_88;
            local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
            local_58._0_8_ = &PTR__lazy_ostream_013892a8;
            local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_48._8_8_ = &local_b8;
            local_e0 = (undefined1  [8])&local_1c8;
            local_d8.m_message.px =
                 (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
            local_d8._0_8_ = &PTR__lazy_ostream_013890c8;
            local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_c0 = (string *)local_e0;
            pvVar2 = (iterator)0x1;
            pvVar3 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b6f6,
                       (size_t)&local_b8.m_message,0x17f,local_58,"6789\'0000",local_e0 + 8);
            boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar1) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            local_1b0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_1a8 = "";
            local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_04.m_end = (iterator)0x180;
            file_04.m_begin = (iterator)&local_1b0;
            msg_04.m_end = pvVar3;
            msg_04.m_begin = pvVar2;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                       (size_t)&local_1c0,msg_04);
            local_120.m_message.px =
                 (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
            local_120._0_8_ = &PTR__lazy_ostream_01388f08;
            local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_108 = "";
            local_78._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"12345.","");
            oVar4 = ParseMoney(&local_78);
            local_88._M_value =
                 oVar4.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload;
            local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long>._M_engaged;
            if (((undefined1  [16])
                 oVar4.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              local_1c8 = 0x11f6def1900;
              local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)(local_88._M_value == 0x11f6def1900);
              local_a0.m_message.px = (element_type *)0x0;
              local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_b8.m_message.px = (element_type *)0xf4a348;
              local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
              local_b8._0_8_ = &local_88;
              local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
              local_58._0_8_ = &PTR__lazy_ostream_013892a8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_48._8_8_ = &local_b8;
              local_e0 = (undefined1  [8])&local_1c8;
              local_d8.m_message.px =
                   (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
              local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
              local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_c0 = (string *)local_e0;
              pvVar2 = (iterator)0x1;
              pvVar3 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b723,
                         (size_t)&local_b8.m_message,0x180,local_58,"COIN * 12345",local_e0 + 8);
              boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              local_1d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
              ;
              local_1d0 = "";
              local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_05.m_end = (iterator)0x182;
              file_05.m_begin = (iterator)&local_1d8;
              msg_05.m_end = pvVar3;
              msg_05.m_begin = pvVar2;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                         (size_t)&local_1e8,msg_05);
              local_120.m_message.px =
                   (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
              local_120._0_8_ = &PTR__lazy_ostream_01388f08;
              local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_108 = "";
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"12345.6789","");
              oVar4 = ParseMoney(&local_78);
              local_88._M_value =
                   oVar4.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
              local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_engaged;
              if (((undefined1  [16])
                   oVar4.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                local_1c8 = 0x11f71fb0450;
                local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
                value = (readonly_property<bool>)(local_88._M_value == 0x11f71fb0450);
                local_a0.m_message.px = (element_type *)0x0;
                local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_b8.m_message.px = (element_type *)0xf4a348;
                local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                local_b8._0_8_ = &local_88;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_48._8_8_ = &local_b8;
                local_e0 = (undefined1  [8])&local_1c8;
                local_d8.m_message.px =
                     (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_c0 = (string *)local_e0;
                pvVar2 = (iterator)0x1;
                pvVar3 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b74d,
                           (size_t)&local_b8.m_message,0x182,local_58,"(COIN/10000)*123456789",
                           local_e0 + 8);
                boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
                paVar1 = &local_78.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != paVar1) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                local_1f8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                ;
                local_1f0 = "";
                local_208 = &boost::unit_test::basic_cstring<char_const>::null;
                local_200 = &boost::unit_test::basic_cstring<char_const>::null;
                file_06.m_end = (iterator)0x184;
                file_06.m_begin = (iterator)&local_1f8;
                msg_06.m_end = pvVar3;
                msg_06.m_begin = pvVar2;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                           (size_t)&local_208,msg_06);
                local_120.m_message.px =
                     (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
                local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_108 = "";
                local_78._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_78,"10000000.00","");
                oVar4 = ParseMoney(&local_78);
                local_88._M_value =
                     oVar4.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload;
                local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_engaged;
                if (((undefined1  [16])
                     oVar4.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    std::__throw_bad_optional_access();
                  }
                }
                else {
                  local_1c8 = 1000000000000000;
                  local_a0.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)(local_88._M_value == 1000000000000000);
                  local_a0.m_message.px = (element_type *)0x0;
                  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_b8.m_message.px = (element_type *)0xf4a348;
                  local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                  local_b8._0_8_ = &local_88;
                  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                  local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                  local_48._8_8_ = &local_b8;
                  local_e0 = (undefined1  [8])&local_1c8;
                  local_d8.m_message.px =
                       (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                  local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                  local_d8.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_c0 = (string *)local_e0;
                  pvVar2 = (iterator)0x1;
                  pvVar3 = (iterator)0x2;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b785,
                             (size_t)&local_b8.m_message,0x184,local_58,"COIN*10000000",local_e0 + 8
                            );
                  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != paVar1) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                  }
                  local_218 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                  ;
                  local_210 = "";
                  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_07.m_end = (iterator)0x185;
                  file_07.m_begin = (iterator)&local_218;
                  msg_07.m_end = pvVar3;
                  msg_07.m_begin = pvVar2;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                             (size_t)&local_228,msg_07);
                  local_120.m_message.px =
                       (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
                  local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                  local_120.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_108 = "";
                  local_78._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_78,"1000000.00","");
                  oVar4 = ParseMoney(&local_78);
                  local_88._M_value =
                       oVar4.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long>._M_payload;
                  local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long>._M_engaged;
                  if (((undefined1  [16])
                       oVar4.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      std::__throw_bad_optional_access();
                    }
                  }
                  else {
                    local_1c8 = 100000000000000;
                    local_a0.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value =
                         (readonly_property<bool>)(local_88._M_value == 100000000000000);
                    local_a0.m_message.px = (element_type *)0x0;
                    local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                    local_b8.m_message.px = (element_type *)0xf4a348;
                    local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                    local_b8._0_8_ = &local_88;
                    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                    local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst
                    ;
                    local_48._8_8_ = &local_b8;
                    local_e0 = (undefined1  [8])&local_1c8;
                    local_d8.m_message.px =
                         (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                    local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                    local_d8.m_message.pn.pi_ =
                         (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                    local_c0 = (string *)local_e0;
                    pvVar2 = (iterator)0x1;
                    pvVar3 = (iterator)0x2;
                    boost::test_tools::tt_detail::report_assertion
                              (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b7b5,
                               (size_t)&local_b8.m_message,0x185,local_58,"COIN*1000000",
                               local_e0 + 8);
                    boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_78._M_dataplus._M_p != paVar1) {
                      operator_delete(local_78._M_dataplus._M_p,
                                      local_78.field_2._M_allocated_capacity + 1);
                    }
                    local_238 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                    ;
                    local_230 = "";
                    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
                    file_08.m_end = (iterator)0x186;
                    file_08.m_begin = (iterator)&local_238;
                    msg_08.m_end = pvVar3;
                    msg_08.m_begin = pvVar2;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                               (size_t)&local_248,msg_08);
                    local_120.m_message.px =
                         (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
                    local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                    local_120.m_message.pn.pi_ =
                         (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                    local_108 = "";
                    local_78._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_78,"100000.00","");
                    oVar4 = ParseMoney(&local_78);
                    local_88._M_value =
                         oVar4.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_payload;
                    local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long>._M_engaged;
                    if (((undefined1  [16])
                         oVar4.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                        (undefined1  [16])0x0) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        std::__throw_bad_optional_access();
                      }
                    }
                    else {
                      local_1c8 = 10000000000000;
                      local_a0.p_predicate_value.super_readonly_property<bool>.
                      super_class_property<bool>.value =
                           (readonly_property<bool>)(local_88._M_value == 10000000000000);
                      local_a0.m_message.px = (element_type *)0x0;
                      local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                      local_b8.m_message.px = (element_type *)0xf4a348;
                      local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                      local_b8._0_8_ = &local_88;
                      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                      local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                      local_48._M_allocated_capacity =
                           (size_type)boost::unit_test::lazy_ostream::inst;
                      local_48._8_8_ = &local_b8;
                      local_e0 = (undefined1  [8])&local_1c8;
                      local_d8.m_message.px =
                           (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                      local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                      local_d8.m_message.pn.pi_ =
                           (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      local_c0 = (string *)local_e0;
                      pvVar2 = (iterator)0x1;
                      pvVar3 = (iterator)0x2;
                      boost::test_tools::tt_detail::report_assertion
                                (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b7e3,
                                 (size_t)&local_b8.m_message,0x186,local_58,"COIN*100000",
                                 local_e0 + 8);
                      boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_78._M_dataplus._M_p != paVar1) {
                        operator_delete(local_78._M_dataplus._M_p,
                                        local_78.field_2._M_allocated_capacity + 1);
                      }
                      local_258 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                      ;
                      local_250 = "";
                      local_268 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_260 = &boost::unit_test::basic_cstring<char_const>::null;
                      file_09.m_end = (iterator)0x187;
                      file_09.m_begin = (iterator)&local_258;
                      msg_09.m_end = pvVar3;
                      msg_09.m_begin = pvVar2;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                                 (size_t)&local_268,msg_09);
                      local_120.m_message.px =
                           (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
                      local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                      local_120.m_message.pn.pi_ =
                           (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      local_108 = "";
                      local_78._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_78,"10000.00","");
                      oVar4 = ParseMoney(&local_78);
                      local_88._M_value =
                           oVar4.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_payload;
                      local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                 super__Optional_payload_base<long>._M_engaged;
                      if (((undefined1  [16])
                           oVar4.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                          (undefined1  [16])0x0) {
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          std::__throw_bad_optional_access();
                        }
                      }
                      else {
                        local_1c8 = 1000000000000;
                        local_a0.p_predicate_value.super_readonly_property<bool>.
                        super_class_property<bool>.value =
                             (readonly_property<bool>)(local_88._M_value == 1000000000000);
                        local_a0.m_message.px = (element_type *)0x0;
                        local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_b8.m_message.px = (element_type *)0xf4a348;
                        local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                        local_b8._0_8_ = &local_88;
                        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                        local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                        local_48._M_allocated_capacity =
                             (size_type)boost::unit_test::lazy_ostream::inst;
                        local_48._8_8_ = &local_b8;
                        local_e0 = (undefined1  [8])&local_1c8;
                        local_d8.m_message.px =
                             (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                        local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                        local_d8.m_message.pn.pi_ =
                             (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                        local_c0 = (string *)local_e0;
                        pvVar2 = (iterator)0x1;
                        pvVar3 = (iterator)0x2;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b80f,
                                   (size_t)&local_b8.m_message,0x187,local_58,"COIN*10000",
                                   local_e0 + 8);
                        boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_78._M_dataplus._M_p != paVar1) {
                          operator_delete(local_78._M_dataplus._M_p,
                                          local_78.field_2._M_allocated_capacity + 1);
                        }
                        local_278 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_270 = "";
                        local_288 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_280 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_10.m_end = (iterator)0x188;
                        file_10.m_begin = (iterator)&local_278;
                        msg_10.m_end = pvVar3;
                        msg_10.m_begin = pvVar2;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                                   (size_t)&local_288,msg_10);
                        local_120.m_message.px =
                             (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
                        local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                        local_120.m_message.pn.pi_ =
                             (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                        local_108 = "";
                        local_78._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_78,"1000.00","");
                        oVar4 = ParseMoney(&local_78);
                        local_88._M_value =
                             oVar4.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long>._M_payload;
                        local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                   super__Optional_payload_base<long>._M_engaged;
                        if (((undefined1  [16])
                             oVar4.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                            (undefined1  [16])0x0) {
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            std::__throw_bad_optional_access();
                          }
                        }
                        else {
                          local_1c8 = 100000000000;
                          local_a0.p_predicate_value.super_readonly_property<bool>.
                          super_class_property<bool>.value =
                               (readonly_property<bool>)(local_88._M_value == 100000000000);
                          local_a0.m_message.px = (element_type *)0x0;
                          local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                          local_b8.m_message.px = (element_type *)0xf4a348;
                          local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                          local_b8._0_8_ = &local_88;
                          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                          local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                          local_48._M_allocated_capacity =
                               (size_type)boost::unit_test::lazy_ostream::inst;
                          local_48._8_8_ = &local_b8;
                          local_e0 = (undefined1  [8])&local_1c8;
                          local_d8.m_message.px =
                               (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                          local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                          local_d8.m_message.pn.pi_ =
                               (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                          local_c0 = (string *)local_e0;
                          pvVar2 = (iterator)0x1;
                          pvVar3 = (iterator)0x2;
                          boost::test_tools::tt_detail::report_assertion
                                    (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b839,
                                     (size_t)&local_b8.m_message,0x188,local_58,"COIN*1000",
                                     local_e0 + 8);
                          boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_78._M_dataplus._M_p != paVar1) {
                            operator_delete(local_78._M_dataplus._M_p,
                                            local_78.field_2._M_allocated_capacity + 1);
                          }
                          local_298 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_290 = "";
                          local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
                          file_11.m_end = (iterator)0x189;
                          file_11.m_begin = (iterator)&local_298;
                          msg_11.m_end = pvVar3;
                          msg_11.m_begin = pvVar2;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                                     (size_t)&local_2a8,msg_11);
                          local_120.m_message.px =
                               (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
                          local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                          local_120.m_message.pn.pi_ =
                               (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                          local_108 = "";
                          local_78._M_dataplus._M_p = (pointer)paVar1;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_78,"100.00","");
                          oVar4 = ParseMoney(&local_78);
                          local_88._M_value =
                               oVar4.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long>._M_payload;
                          local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                     super__Optional_payload_base<long>._M_engaged;
                          if (((undefined1  [16])
                               oVar4.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) {
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              std::__throw_bad_optional_access();
                            }
                          }
                          else {
                            local_1c8 = 10000000000;
                            local_a0.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value =
                                 (readonly_property<bool>)(local_88._M_value == 10000000000);
                            local_a0.m_message.px = (element_type *)0x0;
                            local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                            local_b8.m_message.px = (element_type *)0xf4a348;
                            local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                            local_b8._0_8_ = &local_88;
                            local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                            local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                            local_48._M_allocated_capacity =
                                 (size_type)boost::unit_test::lazy_ostream::inst;
                            local_48._8_8_ = &local_b8;
                            local_e0 = (undefined1  [8])&local_1c8;
                            local_d8.m_message.px =
                                 (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00)
                            ;
                            local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                            local_d8.m_message.pn.pi_ =
                                 (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                            local_c0 = (string *)local_e0;
                            pvVar2 = (iterator)0x1;
                            pvVar3 = (iterator)0x2;
                            boost::test_tools::tt_detail::report_assertion
                                      (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b861,
                                       (size_t)&local_b8.m_message,0x189,local_58,"COIN*100",
                                       local_e0 + 8);
                            boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_78._M_dataplus._M_p != paVar1) {
                              operator_delete(local_78._M_dataplus._M_p,
                                              local_78.field_2._M_allocated_capacity + 1);
                            }
                            local_2b8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                            ;
                            local_2b0 = "";
                            local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_12.m_end = (iterator)0x18a;
                            file_12.m_begin = (iterator)&local_2b8;
                            msg_12.m_end = pvVar3;
                            msg_12.m_begin = pvVar2;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_12,(size_t)&local_2c8,msg_12);
                            local_120.m_message.px =
                                 (element_type *)
                                 ((ulong)local_120.m_message.px & 0xffffffffffffff00);
                            local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                            local_120.m_message.pn.pi_ =
                                 (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                            local_108 = "";
                            local_78._M_dataplus._M_p = (pointer)paVar1;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_78,"10.00","");
                            oVar4 = ParseMoney(&local_78);
                            local_88._M_value =
                                 oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                 super__Optional_payload_base<long>._M_payload;
                            local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>._M_engaged;
                            if (((undefined1  [16])
                                 oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                 super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                                (undefined1  [16])0x0) {
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                std::__throw_bad_optional_access();
                              }
                            }
                            else {
                              local_1c8 = 1000000000;
                              local_a0.p_predicate_value.super_readonly_property<bool>.
                              super_class_property<bool>.value =
                                   (readonly_property<bool>)(local_88._M_value == 1000000000);
                              local_a0.m_message.px = (element_type *)0x0;
                              local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                              local_b8.m_message.px = (element_type *)0xf4a348;
                              local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                              local_b8._0_8_ = &local_88;
                              local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                              local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                              local_48._M_allocated_capacity =
                                   (size_type)boost::unit_test::lazy_ostream::inst;
                              local_48._8_8_ = &local_b8;
                              local_e0 = (undefined1  [8])&local_1c8;
                              local_d8.m_message.px =
                                   (element_type *)
                                   ((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                              local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                              local_d8.m_message.pn.pi_ =
                                   (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                              local_c0 = (string *)local_e0;
                              pvVar2 = (iterator)0x1;
                              pvVar3 = (iterator)0x2;
                              boost::test_tools::tt_detail::report_assertion
                                        (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b887,
                                         (size_t)&local_b8.m_message,0x18a,local_58,"COIN*10",
                                         local_e0 + 8);
                              boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_78._M_dataplus._M_p != paVar1) {
                                operator_delete(local_78._M_dataplus._M_p,
                                                local_78.field_2._M_allocated_capacity + 1);
                              }
                              local_2d8 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                              ;
                              local_2d0 = "";
                              local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
                              local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
                              file_13.m_end = (iterator)0x18b;
                              file_13.m_begin = (iterator)&local_2d8;
                              msg_13.m_end = pvVar3;
                              msg_13.m_begin = pvVar2;
                              boost::unit_test::unit_test_log_t::set_checkpoint
                                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                         file_13,(size_t)&local_2e8,msg_13);
                              local_120.m_message.px =
                                   (element_type *)
                                   ((ulong)local_120.m_message.px & 0xffffffffffffff00);
                              local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                              local_120.m_message.pn.pi_ =
                                   (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                              local_108 = "";
                              local_78._M_dataplus._M_p = (pointer)paVar1;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_78,"1.00","");
                              oVar4 = ParseMoney(&local_78);
                              local_88._M_value =
                                   oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                   super__Optional_payload_base<long>._M_payload;
                              local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                         super__Optional_payload_base<long>._M_engaged;
                              if (((undefined1  [16])
                                   oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                   super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) {
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  std::__throw_bad_optional_access();
                                }
                              }
                              else {
                                local_a0.p_predicate_value.super_readonly_property<bool>.
                                super_class_property<bool>.value =
                                     (readonly_property<bool>)(local_88._M_value == 100000000);
                                local_a0.m_message.px = (element_type *)0x0;
                                local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                                local_b8.m_message.px = (element_type *)0xf4a348;
                                local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                                local_b8._0_8_ = &local_88;
                                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                                local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                local_48._M_allocated_capacity =
                                     (size_type)boost::unit_test::lazy_ostream::inst;
                                local_48._8_8_ = &local_b8;
                                local_e0 = (undefined1  [8])&COIN;
                                local_d8.m_message.px =
                                     (element_type *)
                                     ((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                                local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                local_d8.m_message.pn.pi_ =
                                     (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                                local_c0 = (string *)local_e0;
                                pvVar2 = (iterator)0x1;
                                pvVar3 = (iterator)0x2;
                                boost::test_tools::tt_detail::report_assertion
                                          (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,0xf4b8ab
                                           ,(size_t)&local_b8.m_message,0x18b,local_58,"COIN",
                                           local_e0 + 8);
                                boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_78._M_dataplus._M_p != paVar1) {
                                  operator_delete(local_78._M_dataplus._M_p,
                                                  local_78.field_2._M_allocated_capacity + 1);
                                }
                                local_2f8 = 
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                ;
                                local_2f0 = "";
                                local_308 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_300 = &boost::unit_test::basic_cstring<char_const>::null;
                                file_14.m_end = (iterator)0x18c;
                                file_14.m_begin = (iterator)&local_2f8;
                                msg_14.m_end = pvVar3;
                                msg_14.m_begin = pvVar2;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           file_14,(size_t)&local_308,msg_14);
                                local_120.m_message.px =
                                     (element_type *)
                                     ((ulong)local_120.m_message.px & 0xffffffffffffff00);
                                local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                local_120.m_message.pn.pi_ =
                                     (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                                local_108 = "";
                                local_78._M_dataplus._M_p = (pointer)paVar1;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_78,"1","");
                                oVar4 = ParseMoney(&local_78);
                                local_88._M_value =
                                     oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                     super__Optional_payload_base<long>._M_payload;
                                local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                           super__Optional_payload_base<long>._M_engaged;
                                if (((undefined1  [16])
                                     oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                     super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) {
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    std::__throw_bad_optional_access();
                                  }
                                }
                                else {
                                  local_a0.p_predicate_value.super_readonly_property<bool>.
                                  super_class_property<bool>.value =
                                       (readonly_property<bool>)(local_88._M_value == 100000000);
                                  local_a0.m_message.px = (element_type *)0x0;
                                  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                                  local_b8.m_message.px = (element_type *)0xf4a348;
                                  local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                                  local_b8._0_8_ = &local_88;
                                  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                                  local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                  local_48._M_allocated_capacity =
                                       (size_type)boost::unit_test::lazy_ostream::inst;
                                  local_48._8_8_ = &local_b8;
                                  local_e0 = (undefined1  [8])&COIN;
                                  local_d8.m_message.px =
                                       (element_type *)
                                       ((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                                  local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                  local_d8.m_message.pn.pi_ =
                                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                                  local_c0 = (string *)local_e0;
                                  pvVar2 = (iterator)0x1;
                                  pvVar3 = (iterator)0x2;
                                  boost::test_tools::tt_detail::report_assertion
                                            (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,
                                             0xf4b8c6,(size_t)&local_b8.m_message,0x18c,local_58,
                                             "COIN",local_e0 + 8);
                                  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn)
                                  ;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_78._M_dataplus._M_p != paVar1) {
                                    operator_delete(local_78._M_dataplus._M_p,
                                                    local_78.field_2._M_allocated_capacity + 1);
                                  }
                                  local_318 = 
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                  ;
                                  local_310 = "";
                                  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
                                  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
                                  file_15.m_end = (iterator)0x18d;
                                  file_15.m_begin = (iterator)&local_318;
                                  msg_15.m_end = pvVar3;
                                  msg_15.m_begin = pvVar2;
                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                            (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                             file_15,(size_t)&local_328,msg_15);
                                  local_120.m_message.px =
                                       (element_type *)
                                       ((ulong)local_120.m_message.px & 0xffffffffffffff00);
                                  local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                  local_120.m_message.pn.pi_ =
                                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                                  local_108 = "";
                                  local_78._M_dataplus._M_p = (pointer)paVar1;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_78,"   1","");
                                  oVar4 = ParseMoney(&local_78);
                                  local_88._M_value =
                                       oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>._M_payload;
                                  local_80 = oVar4.super__Optional_base<long,_true,_true>._M_payload
                                             .super__Optional_payload_base<long>._M_engaged;
                                  if (((undefined1  [16])
                                       oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long> & (undefined1  [16])0x1)
                                      == (undefined1  [16])0x0) {
                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                      std::__throw_bad_optional_access();
                                    }
                                  }
                                  else {
                                    local_a0.p_predicate_value.super_readonly_property<bool>.
                                    super_class_property<bool>.value =
                                         (readonly_property<bool>)(local_88._M_value == 100000000);
                                    local_a0.m_message.px = (element_type *)0x0;
                                    local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                                    local_b8.m_message.px = (element_type *)0xf4a348;
                                    local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                                    local_b8._0_8_ = &local_88;
                                    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                                    local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                    local_48._M_allocated_capacity =
                                         (size_type)boost::unit_test::lazy_ostream::inst;
                                    local_48._8_8_ = &local_b8;
                                    local_e0 = (undefined1  [8])&COIN;
                                    local_d8.m_message.px =
                                         (element_type *)
                                         ((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                                    local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                    local_d8.m_message.pn.pi_ =
                                         (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                                    local_c0 = (string *)local_e0;
                                    pvVar2 = (iterator)0x1;
                                    pvVar3 = (iterator)0x2;
                                    boost::test_tools::tt_detail::report_assertion
                                              (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,
                                               0xf4b8e3,(size_t)&local_b8.m_message,0x18d,local_58,
                                               "COIN",local_e0 + 8);
                                    boost::detail::shared_count::~shared_count
                                              (&local_a0.m_message.pn);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_78._M_dataplus._M_p != paVar1) {
                                      operator_delete(local_78._M_dataplus._M_p,
                                                      local_78.field_2._M_allocated_capacity + 1);
                                    }
                                    local_338 = 
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                    ;
                                    local_330 = "";
                                    local_348 = &boost::unit_test::basic_cstring<char_const>::null;
                                    local_340 = &boost::unit_test::basic_cstring<char_const>::null;
                                    file_16.m_end = (iterator)0x18e;
                                    file_16.m_begin = (iterator)&local_338;
                                    msg_16.m_end = pvVar3;
                                    msg_16.m_begin = pvVar2;
                                    boost::unit_test::unit_test_log_t::set_checkpoint
                                              (boost::unit_test::(anonymous_namespace)::
                                               unit_test_log,file_16,(size_t)&local_348,msg_16);
                                    local_120.m_message.px =
                                         (element_type *)
                                         ((ulong)local_120.m_message.px & 0xffffffffffffff00);
                                    local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                    local_120.m_message.pn.pi_ =
                                         (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                                    local_108 = "";
                                    local_78._M_dataplus._M_p = (pointer)paVar1;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_78,"1   ","");
                                    oVar4 = ParseMoney(&local_78);
                                    local_88._M_value =
                                         oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                         super__Optional_payload_base<long>._M_payload;
                                    local_80 = oVar4.super__Optional_base<long,_true,_true>.
                                               _M_payload.super__Optional_payload_base<long>.
                                               _M_engaged;
                                    if (((undefined1  [16])
                                         oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                         super__Optional_payload_base<long> & (undefined1  [16])0x1)
                                        == (undefined1  [16])0x0) {
                                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                        std::__throw_bad_optional_access();
                                      }
                                    }
                                    else {
                                      local_a0.p_predicate_value.super_readonly_property<bool>.
                                      super_class_property<bool>.value =
                                           (readonly_property<bool>)(local_88._M_value == 100000000)
                                      ;
                                      local_a0.m_message.px = (element_type *)0x0;
                                      local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                                      local_b8.m_message.px = (element_type *)0xf4a348;
                                      local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                                      local_b8._0_8_ = &local_88;
                                      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                                      local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                      local_48._M_allocated_capacity =
                                           (size_type)boost::unit_test::lazy_ostream::inst;
                                      local_48._8_8_ = &local_b8;
                                      local_e0 = (undefined1  [8])&COIN;
                                      local_d8.m_message.px =
                                           (element_type *)
                                           ((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                                      local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                      local_d8.m_message.pn.pi_ =
                                           (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                                      local_c0 = (string *)local_e0;
                                      pvVar2 = (iterator)0x1;
                                      pvVar3 = (iterator)0x2;
                                      boost::test_tools::tt_detail::report_assertion
                                                (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,
                                                 0xf4b903,(size_t)&local_b8.m_message,0x18e,local_58
                                                 ,"COIN",local_e0 + 8);
                                      boost::detail::shared_count::~shared_count
                                                (&local_a0.m_message.pn);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_78._M_dataplus._M_p != paVar1) {
                                        operator_delete(local_78._M_dataplus._M_p,
                                                        local_78.field_2._M_allocated_capacity + 1);
                                      }
                                      local_358 = 
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                      ;
                                      local_350 = "";
                                      local_368 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_360 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      file_17.m_end = (iterator)0x18f;
                                      file_17.m_begin = (iterator)&local_358;
                                      msg_17.m_end = pvVar3;
                                      msg_17.m_begin = pvVar2;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,file_17,(size_t)&local_368,msg_17);
                                      local_120.m_message.px =
                                           (element_type *)
                                           ((ulong)local_120.m_message.px & 0xffffffffffffff00);
                                      local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                      local_120.m_message.pn.pi_ =
                                           (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                                      local_108 = "";
                                      local_78._M_dataplus._M_p = (pointer)paVar1;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_78,"  1 ","");
                                      oVar4 = ParseMoney(&local_78);
                                      local_88._M_value =
                                           oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                           super__Optional_payload_base<long>._M_payload;
                                      local_80 = oVar4.super__Optional_base<long,_true,_true>.
                                                 _M_payload.super__Optional_payload_base<long>.
                                                 _M_engaged;
                                      if (((undefined1  [16])
                                           oVar4.super__Optional_base<long,_true,_true>._M_payload.
                                           super__Optional_payload_base<long> &
                                          (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                          std::__throw_bad_optional_access();
                                        }
                                      }
                                      else {
                                        local_a0.p_predicate_value.super_readonly_property<bool>.
                                        super_class_property<bool>.value =
                                             (readonly_property<bool>)
                                             (local_88._M_value == 100000000);
                                        local_a0.m_message.px = (element_type *)0x0;
                                        local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                                        local_b8.m_message.px = (element_type *)0xf4a348;
                                        local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                                        local_b8._0_8_ = &local_88;
                                        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                                        local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                        local_48._M_allocated_capacity =
                                             (size_type)boost::unit_test::lazy_ostream::inst;
                                        local_48._8_8_ = &local_b8;
                                        local_e0 = (undefined1  [8])&COIN;
                                        local_d8.m_message.px =
                                             (element_type *)
                                             ((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                                        local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                        local_d8.m_message.pn.pi_ =
                                             (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                                        ;
                                        local_c0 = (string *)local_e0;
                                        pvVar2 = (iterator)0x1;
                                        pvVar3 = (iterator)0x2;
                                        boost::test_tools::tt_detail::report_assertion
                                                  (&local_a0,(lazy_ostream *)&local_120,1,2,REQUIRE,
                                                   0xf4b923,(size_t)&local_b8.m_message,399,local_58
                                                   ,"COIN",local_e0 + 8);
                                        boost::detail::shared_count::~shared_count
                                                  (&local_a0.m_message.pn);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_78._M_dataplus._M_p != paVar1) {
                                          operator_delete(local_78._M_dataplus._M_p,
                                                          local_78.field_2._M_allocated_capacity + 1
                                                         );
                                        }
                                        local_378 = 
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                        ;
                                        local_370 = "";
                                        local_388 = &boost::unit_test::basic_cstring<char_const>::
                                                     null;
                                        local_380 = &boost::unit_test::basic_cstring<char_const>::
                                                     null;
                                        file_18.m_end = (iterator)0x190;
                                        file_18.m_begin = (iterator)&local_378;
                                        msg_18.m_end = pvVar3;
                                        msg_18.m_begin = pvVar2;
                                        boost::unit_test::unit_test_log_t::set_checkpoint
                                                  (boost::unit_test::(anonymous_namespace)::
                                                   unit_test_log,file_18,(size_t)&local_388,msg_18);
                                        local_120.m_message.px =
                                             (element_type *)
                                             ((ulong)local_120.m_message.px & 0xffffffffffffff00);
                                        local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                        local_120.m_message.pn.pi_ =
                                             (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                                        ;
                                        local_108 = "";
                                        local_78._M_dataplus._M_p = (pointer)paVar1;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_78,"0.1","");
                                        oVar4 = ParseMoney(&local_78);
                                        local_88._M_value =
                                             oVar4.super__Optional_base<long,_true,_true>._M_payload
                                             .super__Optional_payload_base<long>._M_payload;
                                        local_80 = oVar4.super__Optional_base<long,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<long>.
                                                   _M_engaged;
                                        if (((undefined1  [16])
                                             oVar4.super__Optional_base<long,_true,_true>._M_payload
                                             .super__Optional_payload_base<long> &
                                            (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                            std::__throw_bad_optional_access();
                                          }
                                        }
                                        else {
                                          local_1c8 = 10000000;
                                          local_a0.p_predicate_value.super_readonly_property<bool>.
                                          super_class_property<bool>.value =
                                               (readonly_property<bool>)
                                               (local_88._M_value == 10000000);
                                          local_a0.m_message.px = (element_type *)0x0;
                                          local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                                          local_b8.m_message.px = (element_type *)0xf4a348;
                                          local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                                          local_b8._0_8_ = &local_88;
                                          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                                          local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                          local_48._M_allocated_capacity =
                                               (size_type)boost::unit_test::lazy_ostream::inst;
                                          local_48._8_8_ = &local_b8;
                                          local_e0 = (undefined1  [8])&local_1c8;
                                          local_d8.m_message.px =
                                               (element_type *)
                                               ((ulong)local_d8.m_message.px & 0xffffffffffffff00);
                                          local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                          local_d8.m_message.pn.pi_ =
                                               (sp_counted_base *)
                                               boost::unit_test::lazy_ostream::inst;
                                          local_c0 = (string *)local_e0;
                                          pvVar2 = (iterator)0x1;
                                          pvVar3 = (iterator)0x2;
                                          boost::test_tools::tt_detail::report_assertion
                                                    (&local_a0,(lazy_ostream *)&local_120,1,2,
                                                     REQUIRE,0xf4b93e,(size_t)&local_b8.m_message,
                                                     400,local_58,"COIN/10",local_e0 + 8);
                                          boost::detail::shared_count::~shared_count
                                                    (&local_a0.m_message.pn);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_78._M_dataplus._M_p != paVar1) {
                                            operator_delete(local_78._M_dataplus._M_p,
                                                            local_78.field_2._M_allocated_capacity +
                                                            1);
                                          }
                                          local_398 = 
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                          ;
                                          local_390 = "";
                                          local_3a8 = &boost::unit_test::basic_cstring<char_const>::
                                                       null;
                                          local_3a0 = &boost::unit_test::basic_cstring<char_const>::
                                                       null;
                                          file_19.m_end = (iterator)0x191;
                                          file_19.m_begin = (iterator)&local_398;
                                          msg_19.m_end = pvVar3;
                                          msg_19.m_begin = pvVar2;
                                          boost::unit_test::unit_test_log_t::set_checkpoint
                                                    (boost::unit_test::(anonymous_namespace)::
                                                     unit_test_log,file_19,(size_t)&local_3a8,msg_19
                                                    );
                                          local_120.m_message.px =
                                               (element_type *)
                                               ((ulong)local_120.m_message.px & 0xffffffffffffff00);
                                          local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                          local_120.m_message.pn.pi_ =
                                               (sp_counted_base *)
                                               boost::unit_test::lazy_ostream::inst;
                                          local_108 = "";
                                          local_78._M_dataplus._M_p = (pointer)paVar1;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_78,"0.01","");
                                          oVar4 = ParseMoney(&local_78);
                                          local_88._M_value =
                                               oVar4.super__Optional_base<long,_true,_true>.
                                               _M_payload.super__Optional_payload_base<long>.
                                               _M_payload;
                                          local_80 = oVar4.super__Optional_base<long,_true,_true>.
                                                     _M_payload.super__Optional_payload_base<long>.
                                                     _M_engaged;
                                          if (((undefined1  [16])
                                               oVar4.super__Optional_base<long,_true,_true>.
                                               _M_payload.super__Optional_payload_base<long> &
                                              (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                              std::__throw_bad_optional_access();
                                            }
                                          }
                                          else {
                                            local_1c8 = 1000000;
                                            local_a0.p_predicate_value.super_readonly_property<bool>
                                            .super_class_property<bool>.value =
                                                 (readonly_property<bool>)
                                                 (local_88._M_value == 1000000);
                                            local_a0.m_message.px = (element_type *)0x0;
                                            local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                                            local_b8.m_message.px = (element_type *)0xf4a348;
                                            local_b8.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
                                            local_b8._0_8_ = &local_88;
                                            local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                                            local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                            local_48._M_allocated_capacity =
                                                 (size_type)boost::unit_test::lazy_ostream::inst;
                                            local_48._8_8_ = &local_b8;
                                            local_e0 = (undefined1  [8])&local_1c8;
                                            local_d8.m_message.px =
                                                 (element_type *)
                                                 ((ulong)local_d8.m_message.px & 0xffffffffffffff00)
                                            ;
                                            local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                            local_d8.m_message.pn.pi_ =
                                                 (sp_counted_base *)
                                                 boost::unit_test::lazy_ostream::inst;
                                            local_c0 = (string *)local_e0;
                                            pvVar2 = (iterator)0x1;
                                            pvVar3 = (iterator)0x2;
                                            boost::test_tools::tt_detail::report_assertion
                                                      (&local_a0,(lazy_ostream *)&local_120,1,2,
                                                       REQUIRE,0xf4b960,(size_t)&local_b8.m_message,
                                                       0x191,local_58,"COIN/100",local_e0 + 8);
                                            boost::detail::shared_count::~shared_count
                                                      (&local_a0.m_message.pn);
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_78._M_dataplus._M_p != paVar1) {
                                              operator_delete(local_78._M_dataplus._M_p,
                                                              local_78.field_2._M_allocated_capacity
                                                              + 1);
                                            }
                                            local_3b8 = 
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                            ;
                                            local_3b0 = "";
                                            local_3c8 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            local_3c0 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            file_20.m_end = (iterator)0x192;
                                            file_20.m_begin = (iterator)&local_3b8;
                                            msg_20.m_end = pvVar3;
                                            msg_20.m_begin = pvVar2;
                                            boost::unit_test::unit_test_log_t::set_checkpoint
                                                      (boost::unit_test::(anonymous_namespace)::
                                                       unit_test_log,file_20,(size_t)&local_3c8,
                                                       msg_20);
                                            local_120.m_message.px =
                                                 (element_type *)
                                                 ((ulong)local_120.m_message.px & 0xffffffffffffff00
                                                 );
                                            local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                            local_120.m_message.pn.pi_ =
                                                 (sp_counted_base *)
                                                 boost::unit_test::lazy_ostream::inst;
                                            local_108 = "";
                                            local_78._M_dataplus._M_p = (pointer)paVar1;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_78,"0.001","");
                                            oVar4 = ParseMoney(&local_78);
                                            local_88._M_value =
                                                 oVar4.super__Optional_base<long,_true,_true>.
                                                 _M_payload.super__Optional_payload_base<long>.
                                                 _M_payload;
                                            local_80 = oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_engaged;
                                            if (((undefined1  [16])
                                                 oVar4.super__Optional_base<long,_true,_true>.
                                                 _M_payload.super__Optional_payload_base<long> &
                                                (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                std::__throw_bad_optional_access();
                                              }
                                            }
                                            else {
                                              local_1c8 = 100000;
                                              local_a0.p_predicate_value.
                                              super_readonly_property<bool>.
                                              super_class_property<bool>.value =
                                                   (readonly_property<bool>)
                                                   (local_88._M_value == 100000);
                                              local_a0.m_message.px = (element_type *)0x0;
                                              local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                                              local_b8.m_message.px = (element_type *)0xf4a348;
                                              local_b8.m_message.pn.pi_ =
                                                   (sp_counted_base *)0xf4a3ab;
                                              local_b8._0_8_ = &local_88;
                                              local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                                              local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                              local_48._M_allocated_capacity =
                                                   (size_type)boost::unit_test::lazy_ostream::inst;
                                              local_48._8_8_ = &local_b8;
                                              local_e0 = (undefined1  [8])&local_1c8;
                                              local_d8.m_message.px =
                                                   (element_type *)
                                                   ((ulong)local_d8.m_message.px &
                                                   0xffffffffffffff00);
                                              local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                              local_d8.m_message.pn.pi_ =
                                                   (sp_counted_base *)
                                                   boost::unit_test::lazy_ostream::inst;
                                              local_c0 = (string *)local_e0;
                                              pvVar2 = (iterator)0x1;
                                              pvVar3 = (iterator)0x2;
                                              boost::test_tools::tt_detail::report_assertion
                                                        (&local_a0,(lazy_ostream *)&local_120,1,2,
                                                         REQUIRE,0xf4b984,
                                                         (size_t)&local_b8.m_message,0x192,local_58,
                                                         "COIN/1000",local_e0 + 8);
                                              boost::detail::shared_count::~shared_count
                                                        (&local_a0.m_message.pn);
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_78._M_dataplus._M_p != paVar1) {
                                                operator_delete(local_78._M_dataplus._M_p,
                                                                local_78.field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                              local_3d8 = 
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                              ;
                                              local_3d0 = "";
                                              local_3e8 = &boost::unit_test::
                                                           basic_cstring<char_const>::null;
                                              local_3e0 = &boost::unit_test::
                                                           basic_cstring<char_const>::null;
                                              file_21.m_end = (iterator)0x193;
                                              file_21.m_begin = (iterator)&local_3d8;
                                              msg_21.m_end = pvVar3;
                                              msg_21.m_begin = pvVar2;
                                              boost::unit_test::unit_test_log_t::set_checkpoint
                                                        (boost::unit_test::(anonymous_namespace)::
                                                         unit_test_log,file_21,(size_t)&local_3e8,
                                                         msg_21);
                                              local_120.m_message.px =
                                                   (element_type *)
                                                   ((ulong)local_120.m_message.px &
                                                   0xffffffffffffff00);
                                              local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                              local_120.m_message.pn.pi_ =
                                                   (sp_counted_base *)
                                                   boost::unit_test::lazy_ostream::inst;
                                              local_108 = "";
                                              local_78._M_dataplus._M_p = (pointer)paVar1;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_78,"0.0001","");
                                              oVar4 = ParseMoney(&local_78);
                                              local_88._M_value =
                                                   oVar4.super__Optional_base<long,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<long>.
                                                   _M_payload;
                                              local_80 = oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged;
                                              if (((undefined1  [16])
                                                   oVar4.super__Optional_base<long,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<long> &
                                                  (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                  std::__throw_bad_optional_access();
                                                }
                                              }
                                              else {
                                                local_1c8 = 10000;
                                                local_a0.p_predicate_value.
                                                super_readonly_property<bool>.
                                                super_class_property<bool>.value =
                                                     (readonly_property<bool>)
                                                     (local_88._M_value == 10000);
                                                local_a0.m_message.px = (element_type *)0x0;
                                                local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                                                local_b8.m_message.px = (element_type *)0xf4a348;
                                                local_b8.m_message.pn.pi_ =
                                                     (sp_counted_base *)0xf4a3ab;
                                                local_b8._0_8_ = &local_88;
                                                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00
                                                ;
                                                local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                                local_48._M_allocated_capacity =
                                                     (size_type)boost::unit_test::lazy_ostream::inst
                                                ;
                                                local_48._8_8_ = &local_b8;
                                                local_e0 = (undefined1  [8])&local_1c8;
                                                local_d8.m_message.px =
                                                     (element_type *)
                                                     ((ulong)local_d8.m_message.px &
                                                     0xffffffffffffff00);
                                                local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                                local_d8.m_message.pn.pi_ =
                                                     (sp_counted_base *)
                                                     boost::unit_test::lazy_ostream::inst;
                                                local_c0 = (string *)local_e0;
                                                pvVar2 = (iterator)0x1;
                                                pvVar3 = (iterator)0x2;
                                                boost::test_tools::tt_detail::report_assertion
                                                          (&local_a0,(lazy_ostream *)&local_120,1,2,
                                                           REQUIRE,0xf4b9aa,
                                                           (size_t)&local_b8.m_message,0x193,
                                                           local_58,"COIN/10000",local_e0 + 8);
                                                boost::detail::shared_count::~shared_count
                                                          (&local_a0.m_message.pn);
                                                if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_78._M_dataplus._M_p != paVar1) {
                                                  operator_delete(local_78._M_dataplus._M_p,
                                                                  local_78.field_2.
                                                                  _M_allocated_capacity + 1);
                                                }
                                                local_3f8 = 
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                ;
                                                local_3f0 = "";
                                                local_408 = &boost::unit_test::
                                                             basic_cstring<char_const>::null;
                                                local_400 = &boost::unit_test::
                                                             basic_cstring<char_const>::null;
                                                file_22.m_end = (iterator)0x194;
                                                file_22.m_begin = (iterator)&local_3f8;
                                                msg_22.m_end = pvVar3;
                                                msg_22.m_begin = pvVar2;
                                                boost::unit_test::unit_test_log_t::set_checkpoint
                                                          (boost::unit_test::(anonymous_namespace)::
                                                           unit_test_log,file_22,(size_t)&local_408,
                                                           msg_22);
                                                local_120.m_message.px =
                                                     (element_type *)
                                                     ((ulong)local_120.m_message.px &
                                                     0xffffffffffffff00);
                                                local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                                local_120.m_message.pn.pi_ =
                                                     (sp_counted_base *)
                                                     boost::unit_test::lazy_ostream::inst;
                                                local_108 = "";
                                                local_78._M_dataplus._M_p = (pointer)paVar1;
                                                std::__cxx11::string::_M_construct<char_const*>
                                                          ((string *)&local_78,"0.00001","");
                                                oVar4 = ParseMoney(&local_78);
                                                local_88._M_value =
                                                     oVar4.super__Optional_base<long,_true,_true>.
                                                     _M_payload.super__Optional_payload_base<long>.
                                                     _M_payload;
                                                local_80 = oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged;
                                                if (((undefined1  [16])
                                                     oVar4.super__Optional_base<long,_true,_true>.
                                                     _M_payload.super__Optional_payload_base<long> &
                                                    (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                                {
                                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                    std::__throw_bad_optional_access();
                                                  }
                                                }
                                                else {
                                                  local_1c8 = 1000;
                                                  local_a0.p_predicate_value.
                                                  super_readonly_property<bool>.
                                                  super_class_property<bool>.value =
                                                       (readonly_property<bool>)
                                                       (local_88._M_value == 1000);
                                                  local_a0.m_message.px = (element_type *)0x0;
                                                  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0
                                                  ;
                                                  local_b8.m_message.px = (element_type *)0xf4a348;
                                                  local_b8.m_message.pn.pi_ =
                                                       (sp_counted_base *)0xf4a3ab;
                                                  local_b8._0_8_ = &local_88;
                                                  local_58._8_8_ =
                                                       local_58._8_8_ & 0xffffffffffffff00;
                                                  local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                                  local_48._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_48._8_8_ = &local_b8;
                                                  local_e0 = (undefined1  [8])&local_1c8;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_c0 = (string *)local_e0;
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x2;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_a0,(lazy_ostream *)&local_120,1,
                                                             2,REQUIRE,0xf4b9d2,
                                                             (size_t)&local_b8.m_message,0x194,
                                                             local_58,"COIN/100000",local_e0 + 8);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_a0.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_78._M_dataplus._M_p != paVar1) {
                                                    operator_delete(local_78._M_dataplus._M_p,
                                                                    local_78.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  local_418 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_410 = "";
                                                  local_428 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_420 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_23.m_end = (iterator)0x195;
                                                  file_23.m_begin = (iterator)&local_418;
                                                  msg_23.m_end = pvVar3;
                                                  msg_23.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_23,
                                                             (size_t)&local_428,msg_23);
                                                  local_120.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_120.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_108 = "";
                                                  local_78._M_dataplus._M_p = (pointer)paVar1;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_78,"0.000001","");
                                                  oVar4 = ParseMoney(&local_78);
                                                  local_88._M_value =
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_80 = oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_1c8 = 100;
                                                    local_a0.p_predicate_value.
                                                    super_readonly_property<bool>.
                                                    super_class_property<bool>.value =
                                                         (readonly_property<bool>)
                                                         (local_88._M_value == 100);
                                                    local_a0.m_message.px = (element_type *)0x0;
                                                    local_a0.m_message.pn.pi_ =
                                                         (sp_counted_base *)0x0;
                                                    local_b8.m_message.px = (element_type *)0xf4a348
                                                    ;
                                                    local_b8.m_message.pn.pi_ =
                                                         (sp_counted_base *)0xf4a3ab;
                                                    local_b8._0_8_ = &local_88;
                                                    local_58._8_8_ =
                                                         local_58._8_8_ & 0xffffffffffffff00;
                                                    local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_48._M_allocated_capacity =
                                                         (size_type)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_48._8_8_ = &local_b8;
                                                    local_e0 = (undefined1  [8])&local_1c8;
                                                    local_d8.m_message.px =
                                                         (element_type *)
                                                         ((ulong)local_d8.m_message.px &
                                                         0xffffffffffffff00);
                                                    local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_d8.m_message.pn.pi_ =
                                                         (sp_counted_base *)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_c0 = (string *)local_e0;
                                                    pvVar2 = (iterator)0x1;
                                                    pvVar3 = (iterator)0x2;
                                                    boost::test_tools::tt_detail::report_assertion
                                                              (&local_a0,(lazy_ostream *)&local_120,
                                                               1,2,REQUIRE,0xf4b9fc,
                                                               (size_t)&local_b8.m_message,0x195,
                                                               local_58,"COIN/1000000",local_e0 + 8)
                                                    ;
                                                    boost::detail::shared_count::~shared_count
                                                              (&local_a0.m_message.pn);
                                                    if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_78._M_dataplus._M_p != paVar1) {
                                                    operator_delete(local_78._M_dataplus._M_p,
                                                                    local_78.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  local_438 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_430 = "";
                                                  local_448 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_440 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_24.m_end = (iterator)0x196;
                                                  file_24.m_begin = (iterator)&local_438;
                                                  msg_24.m_end = pvVar3;
                                                  msg_24.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_24,
                                                             (size_t)&local_448,msg_24);
                                                  local_120.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_120.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_108 = "";
                                                  local_78._M_dataplus._M_p = (pointer)paVar1;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_78,"0.0000001","");
                                                  oVar4 = ParseMoney(&local_78);
                                                  local_88._M_value =
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_80 = oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_1c8 = 10;
                                                    local_a0.p_predicate_value.
                                                    super_readonly_property<bool>.
                                                    super_class_property<bool>.value =
                                                         (readonly_property<bool>)
                                                         (local_88._M_value == 10);
                                                    local_a0.m_message.px = (element_type *)0x0;
                                                    local_a0.m_message.pn.pi_ =
                                                         (sp_counted_base *)0x0;
                                                    local_b8.m_message.px = (element_type *)0xf4a348
                                                    ;
                                                    local_b8.m_message.pn.pi_ =
                                                         (sp_counted_base *)0xf4a3ab;
                                                    local_b8._0_8_ = &local_88;
                                                    local_58._8_8_ =
                                                         local_58._8_8_ & 0xffffffffffffff00;
                                                    local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_48._M_allocated_capacity =
                                                         (size_type)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_48._8_8_ = &local_b8;
                                                    local_e0 = (undefined1  [8])&local_1c8;
                                                    local_d8.m_message.px =
                                                         (element_type *)
                                                         ((ulong)local_d8.m_message.px &
                                                         0xffffffffffffff00);
                                                    local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_d8.m_message.pn.pi_ =
                                                         (sp_counted_base *)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_c0 = (string *)local_e0;
                                                    pvVar2 = (iterator)0x1;
                                                    pvVar3 = (iterator)0x2;
                                                    boost::test_tools::tt_detail::report_assertion
                                                              (&local_a0,(lazy_ostream *)&local_120,
                                                               1,2,REQUIRE,0xf4ba28,
                                                               (size_t)&local_b8.m_message,0x196,
                                                               local_58,"COIN/10000000",local_e0 + 8
                                                              );
                                                    boost::detail::shared_count::~shared_count
                                                              (&local_a0.m_message.pn);
                                                    if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_78._M_dataplus._M_p != paVar1) {
                                                    operator_delete(local_78._M_dataplus._M_p,
                                                                    local_78.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  local_458 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_450 = "";
                                                  local_468 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_460 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_25.m_end = (iterator)0x197;
                                                  file_25.m_begin = (iterator)&local_458;
                                                  msg_25.m_end = pvVar3;
                                                  msg_25.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_25,
                                                             (size_t)&local_468,msg_25);
                                                  local_120.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_120.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_108 = "";
                                                  local_78._M_dataplus._M_p = (pointer)paVar1;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_78,"0.00000001","");
                                                  oVar4 = ParseMoney(&local_78);
                                                  local_88._M_value =
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_80 = oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_1c8 = 1;
                                                    local_a0.p_predicate_value.
                                                    super_readonly_property<bool>.
                                                    super_class_property<bool>.value =
                                                         (readonly_property<bool>)
                                                         (local_88._M_value == 1);
                                                    local_a0.m_message.px = (element_type *)0x0;
                                                    local_a0.m_message.pn.pi_ =
                                                         (sp_counted_base *)0x0;
                                                    local_b8.m_message.px = (element_type *)0xf4a348
                                                    ;
                                                    local_b8.m_message.pn.pi_ =
                                                         (sp_counted_base *)0xf4a3ab;
                                                    local_b8._0_8_ = &local_88;
                                                    local_58._8_8_ =
                                                         local_58._8_8_ & 0xffffffffffffff00;
                                                    local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_48._M_allocated_capacity =
                                                         (size_type)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_48._8_8_ = &local_b8;
                                                    local_e0 = (undefined1  [8])&local_1c8;
                                                    local_d8.m_message.px =
                                                         (element_type *)
                                                         ((ulong)local_d8.m_message.px &
                                                         0xffffffffffffff00);
                                                    local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_d8.m_message.pn.pi_ =
                                                         (sp_counted_base *)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_c0 = (string *)local_e0;
                                                    pvVar2 = (iterator)0x1;
                                                    pvVar3 = (iterator)0x2;
                                                    boost::test_tools::tt_detail::report_assertion
                                                              (&local_a0,(lazy_ostream *)&local_120,
                                                               1,2,REQUIRE,0xf4ba56,
                                                               (size_t)&local_b8.m_message,0x197,
                                                               local_58,"COIN/100000000",
                                                               local_e0 + 8);
                                                    boost::detail::shared_count::~shared_count
                                                              (&local_a0.m_message.pn);
                                                    if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_78._M_dataplus._M_p != paVar1) {
                                                    operator_delete(local_78._M_dataplus._M_p,
                                                                    local_78.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  local_478 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_470 = "";
                                                  local_488 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_480 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_26.m_end = (iterator)0x198;
                                                  file_26.m_begin = (iterator)&local_478;
                                                  msg_26.m_end = pvVar3;
                                                  msg_26.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_26,
                                                             (size_t)&local_488,msg_26);
                                                  local_120.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_120.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_108 = "";
                                                  local_78._M_dataplus._M_p = (pointer)paVar1;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_78," 0.00000001 ","");
                                                  oVar4 = ParseMoney(&local_78);
                                                  local_88._M_value =
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_80 = oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_1c8 = 1;
                                                    local_a0.p_predicate_value.
                                                    super_readonly_property<bool>.
                                                    super_class_property<bool>.value =
                                                         (readonly_property<bool>)
                                                         (local_88._M_value == 1);
                                                    local_a0.m_message.px = (element_type *)0x0;
                                                    local_a0.m_message.pn.pi_ =
                                                         (sp_counted_base *)0x0;
                                                    local_b8.m_message.px = (element_type *)0xf4a348
                                                    ;
                                                    local_b8.m_message.pn.pi_ =
                                                         (sp_counted_base *)0xf4a3ab;
                                                    local_b8._0_8_ = &local_88;
                                                    local_58._8_8_ =
                                                         local_58._8_8_ & 0xffffffffffffff00;
                                                    local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_48._M_allocated_capacity =
                                                         (size_type)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_48._8_8_ = &local_b8;
                                                    local_e0 = (undefined1  [8])&local_1c8;
                                                    local_d8.m_message.px =
                                                         (element_type *)
                                                         ((ulong)local_d8.m_message.px &
                                                         0xffffffffffffff00);
                                                    local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_d8.m_message.pn.pi_ =
                                                         (sp_counted_base *)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_c0 = (string *)local_e0;
                                                    pvVar2 = (iterator)0x1;
                                                    pvVar3 = (iterator)0x2;
                                                    boost::test_tools::tt_detail::report_assertion
                                                              (&local_a0,(lazy_ostream *)&local_120,
                                                               1,2,REQUIRE,0xf4ba84,
                                                               (size_t)&local_b8.m_message,0x198,
                                                               local_58,"COIN/100000000",
                                                               local_e0 + 8);
                                                    boost::detail::shared_count::~shared_count
                                                              (&local_a0.m_message.pn);
                                                    if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_78._M_dataplus._M_p != paVar1) {
                                                    operator_delete(local_78._M_dataplus._M_p,
                                                                    local_78.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  local_498 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_490 = "";
                                                  local_4a8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_4a0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_27.m_end = (iterator)0x199;
                                                  file_27.m_begin = (iterator)&local_498;
                                                  msg_27.m_end = pvVar3;
                                                  msg_27.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_27,
                                                             (size_t)&local_4a8,msg_27);
                                                  local_120.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_120.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_108 = "";
                                                  local_78._M_dataplus._M_p = (pointer)paVar1;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_78,"0.00000001 ","");
                                                  oVar4 = ParseMoney(&local_78);
                                                  local_88._M_value =
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_80 = oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_1c8 = 1;
                                                    local_a0.p_predicate_value.
                                                    super_readonly_property<bool>.
                                                    super_class_property<bool>.value =
                                                         (readonly_property<bool>)
                                                         (local_88._M_value == 1);
                                                    local_a0.m_message.px = (element_type *)0x0;
                                                    local_a0.m_message.pn.pi_ =
                                                         (sp_counted_base *)0x0;
                                                    local_b8.m_message.px = (element_type *)0xf4a348
                                                    ;
                                                    local_b8.m_message.pn.pi_ =
                                                         (sp_counted_base *)0xf4a3ab;
                                                    local_b8._0_8_ = &local_88;
                                                    local_58._8_8_ =
                                                         local_58._8_8_ & 0xffffffffffffff00;
                                                    local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_48._M_allocated_capacity =
                                                         (size_type)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_48._8_8_ = &local_b8;
                                                    local_e0 = (undefined1  [8])&local_1c8;
                                                    local_d8.m_message.px =
                                                         (element_type *)
                                                         ((ulong)local_d8.m_message.px &
                                                         0xffffffffffffff00);
                                                    local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_d8.m_message.pn.pi_ =
                                                         (sp_counted_base *)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_c0 = (string *)local_e0;
                                                    pvVar2 = (iterator)0x1;
                                                    pvVar3 = (iterator)0x2;
                                                    boost::test_tools::tt_detail::report_assertion
                                                              (&local_a0,(lazy_ostream *)&local_120,
                                                               1,2,REQUIRE,0xf4baa7,
                                                               (size_t)&local_b8.m_message,0x199,
                                                               local_58,"COIN/100000000",
                                                               local_e0 + 8);
                                                    boost::detail::shared_count::~shared_count
                                                              (&local_a0.m_message.pn);
                                                    if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_78._M_dataplus._M_p != paVar1) {
                                                    operator_delete(local_78._M_dataplus._M_p,
                                                                    local_78.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  local_4b8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_4b0 = "";
                                                  local_4c8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_4c0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_28.m_end = (iterator)0x19a;
                                                  file_28.m_begin = (iterator)&local_4b8;
                                                  msg_28.m_end = pvVar3;
                                                  msg_28.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_28,
                                                             (size_t)&local_4c8,msg_28);
                                                  local_120.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_120.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_120._0_8_ = &PTR__lazy_ostream_01388f08;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_108 = "";
                                                  local_78._M_dataplus._M_p = (pointer)paVar1;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_78," 0.00000001","");
                                                  oVar4 = ParseMoney(&local_78);
                                                  local_88._M_value =
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                       ._M_payload;
                                                  local_80 = oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged;
                                                  if (((undefined1  [16])
                                                       oVar4.super__Optional_base<long,_true,_true>.
                                                       _M_payload.super__Optional_payload_base<long>
                                                      & (undefined1  [16])0x1) ==
                                                      (undefined1  [16])0x0) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    local_1c8 = 1;
                                                    local_a0.p_predicate_value.
                                                    super_readonly_property<bool>.
                                                    super_class_property<bool>.value =
                                                         (readonly_property<bool>)
                                                         (local_88._M_value == 1);
                                                    local_a0.m_message.px = (element_type *)0x0;
                                                    local_a0.m_message.pn.pi_ =
                                                         (sp_counted_base *)0x0;
                                                    local_b8.m_message.px = (element_type *)0xf4a348
                                                    ;
                                                    local_b8.m_message.pn.pi_ =
                                                         (sp_counted_base *)0xf4a3ab;
                                                    local_b8._0_8_ = &local_88;
                                                    local_58._8_8_ =
                                                         local_58._8_8_ & 0xffffffffffffff00;
                                                    local_58._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_48._M_allocated_capacity =
                                                         (size_type)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_48._8_8_ = &local_b8;
                                                    local_e0 = (undefined1  [8])&local_1c8;
                                                    local_d8.m_message.px =
                                                         (element_type *)
                                                         ((ulong)local_d8.m_message.px &
                                                         0xffffffffffffff00);
                                                    local_d8._0_8_ = &PTR__lazy_ostream_013892a8;
                                                    local_d8.m_message.pn.pi_ =
                                                         (sp_counted_base *)
                                                         boost::unit_test::lazy_ostream::inst;
                                                    local_c0 = (string *)local_e0;
                                                    pvVar2 = (iterator)0x1;
                                                    pvVar3 = (iterator)0x2;
                                                    boost::test_tools::tt_detail::report_assertion
                                                              (&local_a0,(lazy_ostream *)&local_120,
                                                               1,2,REQUIRE,0xf4bad5,
                                                               (size_t)&local_b8.m_message,0x19a,
                                                               local_58,"COIN/100000000",
                                                               local_e0 + 8);
                                                    boost::detail::shared_count::~shared_count
                                                              (&local_a0.m_message.pn);
                                                    if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_78._M_dataplus._M_p != paVar1) {
                                                    operator_delete(local_78._M_dataplus._M_p,
                                                                    local_78.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  local_4d8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_4d0 = "";
                                                  local_4e8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_4e0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_29.m_end = (iterator)0x19d;
                                                  file_29.m_begin = (iterator)&local_4d8;
                                                  msg_29.m_end = pvVar3;
                                                  msg_29.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_29,
                                                             (size_t)&local_4e8,msg_29);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,"100000000.00","");
                                                  _cVar5 = 0x6f4e46;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\"100000000.00\")";
                                                  local_78._M_string_length = 0xf4bb12;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_4f8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_4f0 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_4f8,0x19d);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_508 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_500 = "";
                                                  local_518 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_510 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_30.m_end = (iterator)0x19e;
                                                  file_30.m_begin = (iterator)&local_508;
                                                  msg_30.m_end = pvVar3;
                                                  msg_30.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_30,
                                                             (size_t)&local_518,msg_30);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,"0.000000001","");
                                                  _cVar5 = 0x6f4f4a;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\"0.000000001\")";
                                                  local_78._M_string_length = 0xf4bb2d;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_528 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_520 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_528,0x19e);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_538 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_530 = "";
                                                  local_548 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_540 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_31.m_end = (iterator)0x1a1;
                                                  file_31.m_begin = (iterator)&local_538;
                                                  msg_31.m_end = pvVar3;
                                                  msg_31.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_31,
                                                             (size_t)&local_548,msg_31);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,"");
                                                  _cVar5 = 0x6f504a;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p = "!ParseMoney(\"\")";
                                                  local_78._M_string_length = 0xf4bb3d;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_558 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_550 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_558,0x1a1);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_568 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_560 = "";
                                                  local_578 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_570 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_32.m_end = (iterator)0x1a2;
                                                  file_32.m_begin = (iterator)&local_568;
                                                  msg_32.m_end = pvVar3;
                                                  msg_32.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_32,
                                                             (size_t)&local_578,msg_32);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58," ","");
                                                  _cVar5 = 0x6f514e;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p = "!ParseMoney(\" \")";
                                                  local_78._M_string_length = 0xf4bb4e;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_588 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_580 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_588,0x1a2);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_598 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_590 = "";
                                                  local_5a8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_5a0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_33.m_end = (iterator)0x1a3;
                                                  file_33.m_begin = (iterator)&local_598;
                                                  msg_33.m_end = pvVar3;
                                                  msg_33.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_33,
                                                             (size_t)&local_5a8,msg_33);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,"  ","");
                                                  _cVar5 = 0x6f5252;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p = "!ParseMoney(\"  \")";
                                                  local_78._M_string_length = 0xf4bb60;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_5b8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_5b0 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_5b8,0x1a3);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_5c8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_5c0 = "";
                                                  local_5d8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_5d0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_34.m_end = (iterator)0x1a6;
                                                  file_34.m_begin = (iterator)&local_5c8;
                                                  msg_34.m_end = pvVar3;
                                                  msg_34.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_34,
                                                             (size_t)&local_5d8,msg_34);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,"..","");
                                                  _cVar5 = 0x6f5356;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p = "!ParseMoney(\"..\")";
                                                  local_78._M_string_length = 0xf4bb72;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_5e8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_5e0 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_5e8,0x1a6);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_5f8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_5f0 = "";
                                                  local_608 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_600 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_35.m_end = (iterator)0x1a7;
                                                  file_35.m_begin = (iterator)&local_5f8;
                                                  msg_35.m_end = pvVar3;
                                                  msg_35.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_35,
                                                             (size_t)&local_608,msg_35);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,"0..0","");
                                                  _cVar5 = 0x6f545a;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\"0..0\")";
                                                  local_78._M_string_length = 0xf4bb8b;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_618 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_610 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_618,0x1a7);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_628 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_620 = "";
                                                  local_638 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_630 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_36.m_end = (iterator)0x1a8;
                                                  file_36.m_begin = (iterator)&local_628;
                                                  msg_36.m_end = pvVar3;
                                                  msg_36.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_36,
                                                             (size_t)&local_638,msg_36);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,"1 2","");
                                                  _cVar5 = 0x6f555e;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p = "!ParseMoney(\"1 2\")"
                                                  ;
                                                  local_78._M_string_length = 0xf4bba2;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_648 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_640 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_648,0x1a8);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_658 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_650 = "";
                                                  local_668 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_660 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_37.m_end = (iterator)0x1a9;
                                                  file_37.m_begin = (iterator)&local_658;
                                                  msg_37.m_end = pvVar3;
                                                  msg_37.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_37,
                                                             (size_t)&local_668,msg_37);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58," 1 2 ","");
                                                  _cVar5 = 0x6f5662;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\" 1 2 \")";
                                                  local_78._M_string_length = 0xf4bbbd;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_678 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_670 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_678,0x1a9);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_688 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_680 = "";
                                                  local_698 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_690 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_38.m_end = (iterator)0x1aa;
                                                  file_38.m_begin = (iterator)&local_688;
                                                  msg_38.m_end = pvVar3;
                                                  msg_38.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_38,
                                                             (size_t)&local_698,msg_38);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58," 1.2 3 ","");
                                                  _cVar5 = 0x6f5766;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\" 1.2 3 \")";
                                                  local_78._M_string_length = 0xf4bbdc;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_6a8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_6a0 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_6a8,0x1aa);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_6b8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_6b0 = "";
                                                  local_6c8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_6c0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_39.m_end = (iterator)0x1ab;
                                                  file_39.m_begin = (iterator)&local_6b8;
                                                  msg_39.m_end = pvVar3;
                                                  msg_39.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_39,
                                                             (size_t)&local_6c8,msg_39);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58," 1 2.3 ","");
                                                  _cVar5 = 0x6f586a;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\" 1 2.3 \")";
                                                  local_78._M_string_length = 0xf4bbfb;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_6d8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_6d0 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_6d8,0x1ab);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_6e8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_6e0 = "";
                                                  local_6f8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_6f0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_40.m_end = (iterator)0x1ae;
                                                  file_40.m_begin = (iterator)&local_6e8;
                                                  msg_40.m_end = pvVar3;
                                                  msg_40.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_40,
                                                             (size_t)&local_6f8,msg_40);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58," -1 .2  ","");
                                                  _cVar5 = 0x6f596e;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\" -1 .2  \")";
                                                  local_78._M_string_length = 0xf4bc1c;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_708 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_700 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_708,0x1ae);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_718 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_710 = "";
                                                  local_728 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_720 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_41.m_end = (iterator)0x1af;
                                                  file_41.m_begin = (iterator)&local_718;
                                                  msg_41.m_end = pvVar3;
                                                  msg_41.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_41,
                                                             (size_t)&local_728,msg_41);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,"  1 .2  ","");
                                                  _cVar5 = 0x6f5a72;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\"  1 .2  \")";
                                                  local_78._M_string_length = 0xf4bc3d;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_738 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_730 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_738,0x1af);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_748 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_740 = "";
                                                  local_758 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_750 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_42.m_end = (iterator)0x1b0;
                                                  file_42.m_begin = (iterator)&local_748;
                                                  msg_42.m_end = pvVar3;
                                                  msg_42.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_42,
                                                             (size_t)&local_758,msg_42);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58," +1 .2  ","");
                                                  _cVar5 = 0x6f5b76;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\" +1 .2  \")";
                                                  local_78._M_string_length = 0xf4bc5e;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_768 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_760 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_768,0x1b0);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_778 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_770 = "";
                                                  local_788 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_780 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_43.m_end = (iterator)0x1b3;
                                                  file_43.m_begin = (iterator)&local_778;
                                                  msg_43.m_end = pvVar3;
                                                  msg_43.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_43,
                                                             (size_t)&local_788,msg_43);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,
                                                             "92233720368.54775808","");
                                                  _cVar5 = 0x6f5c7a;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\"92233720368.54775808\")";
                                                  local_78._M_string_length = 0xf4bc82;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_798 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_790 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_798,0x1b3);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_7a8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_7a0 = "";
                                                  local_7b8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_7b0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_44.m_end = (iterator)0x1b6;
                                                  file_44.m_begin = (iterator)&local_7a8;
                                                  msg_44.m_end = pvVar3;
                                                  msg_44.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_44,
                                                             (size_t)&local_7b8,msg_44);
                                                  local_58._0_8_ = &local_48;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)local_58,"-1","");
                                                  _cVar5 = 0x6f5d7e;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p = "!ParseMoney(\"-1\")";
                                                  local_78._M_string_length = 0xf4bc94;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_7c8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_7c0 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_c0 = &local_78;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_7c8,0x1b6);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  local_7d8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_7d0 = "";
                                                  local_7e8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_7e0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_45.m_end = (iterator)0x1b9;
                                                  file_45.m_begin = (iterator)&local_7d8;
                                                  msg_45.m_end = pvVar3;
                                                  msg_45.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_45,
                                                             (size_t)&local_7e8,msg_45);
                                                  local_48._M_allocated_capacity._0_4_ = 0x312d00;
                                                  local_58._8_8_ = 3;
                                                  _cVar5 = 0x6f5e73;
                                                  local_58._0_8_ = &local_48;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\"\\0-1\"s)";
                                                  local_78._M_string_length = 0xf4bca9;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_c0 = &local_78;
                                                  local_7f8 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_7f0 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_7f8,0x1b9);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    local_48._M_allocated_capacity +
                                                                    1);
                                                  }
                                                  local_808 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_800 = "";
                                                  local_818 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_810 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_46.m_end = (iterator)0x1ba;
                                                  file_46.m_begin = (iterator)&local_808;
                                                  msg_46.m_end = pvVar3;
                                                  msg_46.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_46,
                                                             (size_t)&local_818,msg_46);
                                                  _cVar5 = 0x6f5f5c;
                                                  oVar4 = ParseMoney(&
                                                  STRING_WITH_EMBEDDED_NULL_CHAR_abi_cxx11_);
                                                  local_d8._0_8_ =
                                                       CONCAT71(local_d8._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_d8.m_message.px = (element_type *)0x0;
                                                  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0
                                                  ;
                                                  local_120._0_8_ =
                                                       "!ParseMoney(STRING_WITH_EMBEDDED_NULL_CHAR)"
                                                  ;
                                                  local_120.m_message.px = (element_type *)0xf4bcd5;
                                                  local_58._8_8_ =
                                                       local_58._8_8_ & 0xffffffffffffff00;
                                                  local_58._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_48._M_allocated_capacity =
                                                       (size_type)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_828 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_820 = "";
                                                  pvVar2 = (iterator)0x1;
                                                  pvVar3 = (iterator)0x0;
                                                  local_48._8_8_ = &local_120;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)(local_e0 + 8),
                                                             (lazy_ostream *)local_58,1,0,WARN,
                                                             _cVar5,(size_t)&local_828,0x1ba);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_d8.m_message.pn);
                                                  local_838 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_830 = "";
                                                  local_848 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_840 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  file_47.m_end = (iterator)0x1bb;
                                                  file_47.m_begin = (iterator)&local_838;
                                                  msg_47.m_end = pvVar3;
                                                  msg_47.m_begin = pvVar2;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_47,
                                                             (size_t)&local_848,msg_47);
                                                  local_58._8_8_ = 2;
                                                  local_48._M_allocated_capacity._0_3_ = 0x31;
                                                  _cVar5 = 0x6f6031;
                                                  local_58._0_8_ = &local_48;
                                                  oVar4 = ParseMoney((string *)local_58);
                                                  local_c0 = &local_78;
                                                  local_120._0_8_ =
                                                       CONCAT71(local_120._1_7_,
                                                                ~oVar4.
                                                  super__Optional_base<long,_true,_true>._M_payload.
                                                  super__Optional_payload_base<long>._M_engaged) &
                                                  0xffffffffffffff01;
                                                  local_120.m_message.px = (element_type *)0x0;
                                                  local_120.m_message.pn.pi_ =
                                                       (sp_counted_base *)0x0;
                                                  local_78._M_dataplus._M_p =
                                                       "!ParseMoney(\"1\\0\"s)";
                                                  local_78._M_string_length = 0xf4bce9;
                                                  local_d8.m_message.px =
                                                       (element_type *)
                                                       ((ulong)local_d8.m_message.px &
                                                       0xffffffffffffff00);
                                                  local_d8._0_8_ = &PTR__lazy_ostream_01389048;
                                                  local_d8.m_message.pn.pi_ =
                                                       (sp_counted_base *)
                                                       boost::unit_test::lazy_ostream::inst;
                                                  local_858 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                                                  ;
                                                  local_850 = "";
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_120,
                                                             (lazy_ostream *)(local_e0 + 8),1,0,WARN
                                                             ,_cVar5,(size_t)&local_858,0x1bb);
                                                  boost::detail::shared_count::~shared_count
                                                            (&local_120.m_message.pn);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_58._0_8_ != &local_48) {
                                                    operator_delete((void *)local_58._0_8_,
                                                                    (ulong)(local_48.
                                                  _M_allocated_capacity + 1));
                                                  }
                                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                    return;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseMoney)
{
    BOOST_CHECK_EQUAL(ParseMoney("0.0").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney(".").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney("0.").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney(".0").value(), 0);
    BOOST_CHECK_EQUAL(ParseMoney(".6789").value(), 6789'0000);
    BOOST_CHECK_EQUAL(ParseMoney("12345.").value(), COIN * 12345);

    BOOST_CHECK_EQUAL(ParseMoney("12345.6789").value(), (COIN/10000)*123456789);

    BOOST_CHECK_EQUAL(ParseMoney("10000000.00").value(), COIN*10000000);
    BOOST_CHECK_EQUAL(ParseMoney("1000000.00").value(), COIN*1000000);
    BOOST_CHECK_EQUAL(ParseMoney("100000.00").value(), COIN*100000);
    BOOST_CHECK_EQUAL(ParseMoney("10000.00").value(), COIN*10000);
    BOOST_CHECK_EQUAL(ParseMoney("1000.00").value(), COIN*1000);
    BOOST_CHECK_EQUAL(ParseMoney("100.00").value(), COIN*100);
    BOOST_CHECK_EQUAL(ParseMoney("10.00").value(), COIN*10);
    BOOST_CHECK_EQUAL(ParseMoney("1.00").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("1").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("   1").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("1   ").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("  1 ").value(), COIN);
    BOOST_CHECK_EQUAL(ParseMoney("0.1").value(), COIN/10);
    BOOST_CHECK_EQUAL(ParseMoney("0.01").value(), COIN/100);
    BOOST_CHECK_EQUAL(ParseMoney("0.001").value(), COIN/1000);
    BOOST_CHECK_EQUAL(ParseMoney("0.0001").value(), COIN/10000);
    BOOST_CHECK_EQUAL(ParseMoney("0.00001").value(), COIN/100000);
    BOOST_CHECK_EQUAL(ParseMoney("0.000001").value(), COIN/1000000);
    BOOST_CHECK_EQUAL(ParseMoney("0.0000001").value(), COIN/10000000);
    BOOST_CHECK_EQUAL(ParseMoney("0.00000001").value(), COIN/100000000);
    BOOST_CHECK_EQUAL(ParseMoney(" 0.00000001 ").value(), COIN/100000000);
    BOOST_CHECK_EQUAL(ParseMoney("0.00000001 ").value(), COIN/100000000);
    BOOST_CHECK_EQUAL(ParseMoney(" 0.00000001").value(), COIN/100000000);

    // Parsing amount that cannot be represented should fail
    BOOST_CHECK(!ParseMoney("100000000.00"));
    BOOST_CHECK(!ParseMoney("0.000000001"));

    // Parsing empty string should fail
    BOOST_CHECK(!ParseMoney(""));
    BOOST_CHECK(!ParseMoney(" "));
    BOOST_CHECK(!ParseMoney("  "));

    // Parsing two numbers should fail
    BOOST_CHECK(!ParseMoney(".."));
    BOOST_CHECK(!ParseMoney("0..0"));
    BOOST_CHECK(!ParseMoney("1 2"));
    BOOST_CHECK(!ParseMoney(" 1 2 "));
    BOOST_CHECK(!ParseMoney(" 1.2 3 "));
    BOOST_CHECK(!ParseMoney(" 1 2.3 "));

    // Embedded whitespace should fail
    BOOST_CHECK(!ParseMoney(" -1 .2  "));
    BOOST_CHECK(!ParseMoney("  1 .2  "));
    BOOST_CHECK(!ParseMoney(" +1 .2  "));

    // Attempted 63 bit overflow should fail
    BOOST_CHECK(!ParseMoney("92233720368.54775808"));

    // Parsing negative amounts must fail
    BOOST_CHECK(!ParseMoney("-1"));

    // Parsing strings with embedded NUL characters should fail
    BOOST_CHECK(!ParseMoney("\0-1"s));
    BOOST_CHECK(!ParseMoney(STRING_WITH_EMBEDDED_NULL_CHAR));
    BOOST_CHECK(!ParseMoney("1\0"s));
}